

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face.c
# Opt level: O0

bool_t prf_face_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int iVar1;
  int iVar2;
  bfile_t *in_RDX;
  uint16_t *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict1 *data;
  int pos;
  uint32_t in_stack_ffffffffffffffcc;
  int16_t value;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  int iVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar4;
  
  if (*in_RDI == prf_face_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = 4;
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    bf_write(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (uint)((ulong)in_RDI >> 0x20));
    iVar3 = iVar3 + 8;
    bf_put_int32_be(bfile_00,in_stack_ffffffffffffffcc);
    iVar3 = iVar3 + 4;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_int8(in_RDX,(int8_t)((uint)iVar3 >> 0x18));
    iVar3 = iVar3 + 1;
    bf_put_int8(in_RDX,(int8_t)((uint)iVar3 >> 0x18));
    iVar3 = iVar3 + 1;
    bf_put_uint16_be(bfile_00,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_uint16_be(bfile_00,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_int8(in_RDX,(int8_t)((uint)iVar3 >> 0x18));
    iVar3 = iVar3 + 1;
    bf_put_int8(in_RDX,(int8_t)((uint)iVar3 >> 0x18));
    iVar3 = iVar3 + 1;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_int32_be(bfile_00,in_stack_ffffffffffffffcc);
    iVar3 = iVar3 + 4;
    bf_put_uint16_be(bfile_00,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
    iVar3 = iVar3 + 2;
    bf_put_uint8(in_RDX,(uint8_t)((uint)iVar3 >> 0x18));
    iVar3 = iVar3 + 1;
    bf_put_uint8(in_RDX,(uint8_t)((uint)iVar3 >> 0x18));
    iVar1 = iVar3 + 1;
    if (iVar3 + 5 <= (int)(uint)in_RDI[1]) {
      bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
      iVar3 = iVar1 + 4;
      iVar2 = iVar1 + 5;
      iVar1 = iVar3;
      if (iVar2 <= (int)(uint)in_RDI[1]) {
        bf_put_uint8(in_RDX,(uint8_t)((uint)iVar3 >> 0x18));
        iVar2 = iVar3 + 1;
        iVar1 = iVar2;
        if (iVar3 + 2 <= (int)(uint)in_RDI[1]) {
          bf_put_uint8(in_RDX,(uint8_t)((uint)iVar2 >> 0x18));
          iVar3 = iVar2 + 1;
          iVar1 = iVar3;
          if (iVar2 + 3 <= (int)(uint)in_RDI[1]) {
            bf_put_uint16_be(bfile_00,(uint16_t)(in_stack_ffffffffffffffcc >> 0x10));
            iVar2 = iVar3 + 2;
            iVar1 = iVar2;
            if (iVar3 + 6 <= (int)(uint)in_RDI[1]) {
              bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
              iVar3 = iVar2 + 4;
              iVar1 = iVar3;
              if (iVar2 + 8 <= (int)(uint)in_RDI[1]) {
                bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
                iVar2 = iVar3 + 4;
                iVar1 = iVar2;
                if (iVar3 + 8 <= (int)(uint)in_RDI[1]) {
                  bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
                  iVar3 = iVar2 + 4;
                  iVar1 = iVar3;
                  if (iVar2 + 6 <= (int)(uint)in_RDI[1]) {
                    bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
                    iVar2 = iVar3 + 2;
                    iVar1 = iVar2;
                    if (iVar3 + 4 <= (int)(uint)in_RDI[1]) {
                      bf_put_int16_be(bfile_00,(int16_t)(in_stack_ffffffffffffffcc >> 0x10));
                      iVar3 = iVar2 + 2;
                      iVar1 = iVar3;
                      if (iVar2 + 6 <= (int)(uint)in_RDI[1]) {
                        bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
                        iVar2 = iVar3 + 4;
                        iVar1 = iVar2;
                        if (iVar3 + 8 <= (int)(uint)in_RDI[1]) {
                          bf_put_uint32_be(bfile_00,in_stack_ffffffffffffffcc);
                          value = (int16_t)(in_stack_ffffffffffffffcc >> 0x10);
                          iVar3 = iVar2 + 4;
                          iVar1 = iVar3;
                          if (iVar2 + 6 <= (int)(uint)in_RDI[1]) {
                            bf_put_int16_be(bfile_00,value);
                            iVar1 = iVar3 + 2;
                            if (iVar3 + 4 <= (int)(uint)in_RDI[1]) {
                              bf_put_int16_be(bfile_00,value);
                              iVar1 = iVar1 + 2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar1 < (int)(uint)in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar4 = 1;
  }
  else {
    prf_error(6,"tried face node save method for other node type");
    bVar4 = 0;
  }
  return bVar4;
}

Assistant:

static
bool_t
prf_face_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_face_info.opcode ) {
        prf_error( 6, "tried face node save method for other node type" );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        bf_write( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        bf_put_int32_be( bfile, data->ir_color_code ); pos += 4;
        bf_put_int16_be( bfile, data->relative_priority ); pos += 2;
        bf_put_int8( bfile, data->draw_type ); pos += 1;
        bf_put_int8( bfile, data->texture_white ); pos += 1;
        bf_put_uint16_be( bfile, data->color_name_index ); pos += 2;
        bf_put_uint16_be( bfile, data->alternate_color_name_index ); pos += 2;
        bf_put_int8( bfile, data->reserved1 ); pos += 1;
        bf_put_int8( bfile, data->billboard_flags ); pos += 1;
        bf_put_int16_be( bfile, data->detail_texture_pattern_index ); pos += 2;
        bf_put_int16_be( bfile, data->texture_pattern_index ); pos += 2;
        bf_put_int16_be( bfile, data->material_index ); pos += 2;
        bf_put_int16_be( bfile, data->surface_material_code ); pos += 2;
        bf_put_int16_be( bfile, data->feature_id ); pos += 2;
        bf_put_int32_be( bfile, data->ir_material_code ); pos += 4;
        bf_put_uint16_be( bfile, data->transparency ); pos += 2;
        bf_put_uint8( bfile, data->lod_generation_control ); pos += 1;
        bf_put_uint8( bfile, data->line_style_index ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 1) ) break;
        bf_put_uint8( bfile, data->light_mode ); pos += 1;
        if ( node->length < (pos + 1) ) break;
        bf_put_uint8( bfile, data->reserved2 ); pos += 1;
        if ( node->length < (pos + 2) ) break;
        bf_put_uint16_be( bfile, data->reserved3 ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->reserved4 ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->packed_color_primary ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->packed_color_alternate ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->texture_mapping_index ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved5 ); pos += 2;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->primary_color_index ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->alternate_color_index ); pos += 4;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved6 ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->reserved7 ); pos += 2;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}